

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall
AbstractModuleClient::sendStateScriptShortcutMessage(AbstractModuleClient *this,uint16_t function)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_59;
  string local_58;
  TrodesMsg local_38;
  
  TrodesMsg::TrodesMsg(&local_38);
  std::__cxx11::string::string((string *)&local_58,"s2",&local_59);
  TrodesMsg::addcontents<char_const*,unsigned_short>(&local_38,&local_58,"SCTRIG",function);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_38);
  TrodesMsg::~TrodesMsg(&local_38);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendStateScriptShortcutMessage(uint16_t function){
    TrodesMsg m;
    m.addcontents("s2", "SCTRIG", function);
    return sendHardwareMessage(m);
}